

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thstd.c
# Opt level: O1

void std_write(thstd_t *std,char *filename)

{
  void *pvVar1;
  undefined8 in_RAX;
  FILE *__stream;
  size_t size;
  list_node_t *plVar2;
  long lVar3;
  undefined8 *puVar4;
  ulong size_00;
  uint32_t entry_offset;
  int32_t endcode;
  undefined8 local_38;
  
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    std_write_cold_1();
  }
  size_00 = (ulong)(option_version == 0) << 10 | 0x90;
  file_write((FILE *)__stream,(&std->header_06)[option_version != 0],size_00);
  local_38 = CONCAT44(local_38._4_4_,(int)size_00 + (uint)std->header->nb_objects * 4);
  plVar2 = (list_node_t *)&std->entries;
  lVar3 = 0;
  while (plVar2 = plVar2->next, plVar2 != (list_node_t *)0x0) {
    puVar4 = (undefined8 *)plVar2->data;
    *(short *)*puVar4 = (short)lVar3;
    file_seek((FILE *)__stream,size_00 + lVar3 * 4);
    file_write((FILE *)__stream,&local_38,4);
    file_seek((FILE *)__stream,local_38 & 0xffffffff);
    file_write((FILE *)__stream,(void *)*puVar4,0x1c);
    puVar4 = puVar4 + 1;
    while( true ) {
      local_38._0_4_ = (int)local_38 + 0x1c;
      puVar4 = (undefined8 *)*puVar4;
      if (puVar4 == (undefined8 *)0x0) break;
      pvVar1 = (void *)puVar4[2];
      *(undefined2 *)((long)pvVar1 + 2) = 0x1c;
      file_write((FILE *)__stream,pvVar1,0x1c);
    }
    local_38._4_4_ = 0x4ffff;
    file_write((FILE *)__stream,(void *)((long)&local_38 + 4),4);
    local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 4);
    lVar3 = lVar3 + 1;
  }
  plVar2 = (list_node_t *)&std->instances;
  while (plVar2 = plVar2->next, plVar2 != (list_node_t *)0x0) {
    file_write((FILE *)__stream,plVar2->data,0x10);
  }
  local_38 = CONCAT44(0xffffffff,(int)local_38);
  lVar3 = 4;
  do {
    file_write((FILE *)__stream,(void *)((long)&local_38 + 4),4);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  plVar2 = (list_node_t *)&std->instrs;
  while (plVar2 = plVar2->next, plVar2 != (list_node_t *)0x0) {
    pvVar1 = plVar2->data;
    if (option_version == 0) {
      *(undefined2 *)((long)pvVar1 + 6) = 0xc;
      size = 0x14;
    }
    else {
      size = (size_t)*(ushort *)((long)pvVar1 + 6);
    }
    file_write((FILE *)__stream,pvVar1,size);
  }
  lVar3 = 5;
  do {
    file_write((FILE *)__stream,(void *)((long)&local_38 + 4),4);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  fclose(__stream);
  return;
}

Assistant:

static void
std_write(
          thstd_t* std,
          const char *filename)
{
    FILE *stream;
    size_t i;
    std_entry_t *entry;
    std_object_t *quad;
    std_object_instance_t *instance;
    std_instr_t *instr;
    uint32_t offset;
    uint32_t entry_offset;
    int32_t endcode;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                argv0, filename, strerror(errno));
    }

    if (option_version == 0) {
        file_write(stream, std->header_06, sizeof(std_header_06_t));
        offset = sizeof(std_header_06_t);
    } else {
        file_write(stream, std->header_10, sizeof(std_header_10_t));
        offset = sizeof(std_header_10_t);
    }


    entry_offset = (offset +
                    sizeof(int32_t) * (uint32_t)std->header->nb_objects);

    i = 0;
    list_for_each(&std->entries, entry) {
        entry->header->id = i;

        file_seek(stream, offset + i*sizeof(int32_t));
        file_write(stream, &entry_offset, sizeof(uint32_t));

        file_seek(stream, entry_offset);
        file_write(stream, entry->header, sizeof(std_entry_header_t));
        entry_offset += sizeof(std_entry_header_t);

        list_for_each(&entry->quads, quad) {
            quad->size = 0x1c;
            file_write(stream, quad, sizeof(std_object_t));
            entry_offset += sizeof(std_object_t);
        }

        endcode = 0x0004FFFF;
        file_write(stream, &endcode, sizeof(int32_t));
        entry_offset += sizeof(int32_t);

        i++;
    }

    list_for_each(&std->instances, instance) {
        file_write(stream, instance, sizeof(std_object_instance_t));
    }

    endcode = 0xFFFFFFFF;
    for(i = 0; i < 4; i++)
        file_write(stream, &endcode, sizeof(int32_t));

    list_for_each(&std->instrs, instr) {
        if (option_version == 0) {
            instr->size = 12;
            file_write(stream, instr, instr->size + sizeof(uint32_t) * 2);
        }
        else
            file_write(stream, instr, instr->size);
    }

    for(i = 0; i < 5; i++)
        file_write(stream, &endcode, sizeof(int32_t));

    fclose(stream);
}